

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

void __thiscall
DynamicGraph::rollBack
          (DynamicGraph *this,
          list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
          *actions,list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices)

{
  size_t *psVar1;
  pointer puVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  for (p_Var3 = (actions->
                super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)actions;
      p_Var3 = (((_List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    (**(code **)(p_Var3[1]._M_next)->_M_next)();
  }
  while (p_Var3 = (incVertices->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)incVertices) {
    p_Var4 = p_Var3[1]._M_next;
    psVar1 = &(incVertices->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              ._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var3,0x18);
    puVar2 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start + (long)p_Var4;
    *puVar2 = *puVar2 - 1;
  }
  return;
}

Assistant:

void DynamicGraph::rollBack(std::list<std::unique_ptr<Action>> &actions, std::list<Vertex>& incVertices)
{
    for (auto &action : actions) {
        (*action).undo();
    }

    while(!incVertices.empty()) {
        Vertex v = incVertices.front();
        incVertices.pop_front();
        this->level[v]--;
    }
}